

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::i2p_alert::message_abi_cxx11_(string *__return_storage_ptr__,i2p_alert *this)

{
  int iVar1;
  error_category *peVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  allocator<char> local_2c5 [13];
  string local_2b8;
  string local_298;
  char local_278 [8];
  char msg [600];
  i2p_alert *this_local;
  
  peVar2 = boost::system::error_code::category(&this->error);
  iVar1 = (**peVar2->_vptr_error_category)();
  boost::system::error_code::message_abi_cxx11_(&local_2b8,&this->error);
  convert_from_native(&local_298,&local_2b8);
  uVar3 = std::__cxx11::string::c_str();
  snprintf(local_278,600,"i2p_error: [%s] %s",CONCAT44(extraout_var,iVar1),uVar3);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_278,local_2c5);
  std::allocator<char>::~allocator(local_2c5);
  return __return_storage_ptr__;
}

Assistant:

std::string i2p_alert::message() const
	{
		char msg[600];
		std::snprintf(msg, sizeof(msg), "i2p_error: [%s] %s"
			, error.category().name(), convert_from_native(error.message()).c_str());
		return msg;
	}